

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *
vkt::pipeline::anon_unknown_0::createTestTexture<tcu::CompressedTexFormat>
          (MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
           *__return_storage_ptr__,CompressedTexFormat format,VkImageViewType viewType,IVec3 *size,
          int layerCount)

{
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> data;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> data_00;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> data_01;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> data_02;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> data_03;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> data_04;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> data_05;
  int iVar1;
  int iVar2;
  int depth;
  TestTexture1D *this;
  TestTexture1DArray *this_00;
  TestTexture2D *this_01;
  TestTextureCube *this_02;
  TestTextureCubeArray *this_03;
  TestTexture2DArray *this_04;
  TestTexture3D *this_05;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  DefaultDeleter<vkt::pipeline::TestTexture> local_149;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> local_148;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *local_138;
  DefaultDeleter<vkt::pipeline::TestTexture> local_121;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> local_120;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *local_110;
  DefaultDeleter<vkt::pipeline::TestTexture> local_f9;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> local_f8;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *local_e8;
  DefaultDeleter<vkt::pipeline::TestTexture> local_d1;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> local_d0;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *local_c0;
  DefaultDeleter<vkt::pipeline::TestTexture> local_a9;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> local_a8;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *local_98;
  DefaultDeleter<vkt::pipeline::TestTexture> local_81;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> local_80;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *local_70;
  DefaultDeleter<vkt::pipeline::TestTexture> local_5d [13];
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> local_50;
  PtrData<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *local_40;
  VkImageType local_2c;
  undefined1 local_25;
  VkImageType imageType;
  IVec3 *pIStack_20;
  int layerCount_local;
  IVec3 *size_local;
  VkImageViewType viewType_local;
  CompressedTexFormat format_local;
  MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_> *texture;
  
  local_25 = 0;
  imageType = layerCount;
  pIStack_20 = size;
  size_local._0_4_ = viewType;
  size_local._4_4_ = format;
  _viewType_local = __return_storage_ptr__;
  de::details::MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
  ::MovePtr(__return_storage_ptr__);
  local_2c = getCompatibleImageType((VkImageViewType)size_local);
  if (local_2c == VK_IMAGE_TYPE_1D) {
    if (imageType == VK_IMAGE_TYPE_2D) {
      this = (TestTexture1D *)operator_new(0x70);
      iVar1 = tcu::Vector<int,_3>::x(pIStack_20);
      TestTexture1D::TestTexture1D(this,(CompressedTexFormat *)((long)&size_local + 4),iVar1);
      de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(local_5d);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_50);
      local_40 = de::details::MovePtr::operator_cast_to_PtrData(&local_50,(MovePtr *)this);
      data._8_4_ = in_stack_fffffffffffffe20;
      data.ptr = (TestTexture *)in_stack_fffffffffffffe18;
      data._12_4_ = in_stack_fffffffffffffe24;
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
      operator=(__return_storage_ptr__,data);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::~MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_50);
    }
    else {
      this_00 = (TestTexture1DArray *)operator_new(0x70);
      iVar1 = tcu::Vector<int,_3>::x(pIStack_20);
      TestTexture1DArray::TestTexture1DArray
                (this_00,(CompressedTexFormat *)((long)&size_local + 4),iVar1,imageType);
      de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(&local_81);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_80);
      local_70 = de::details::MovePtr::operator_cast_to_PtrData(&local_80,(MovePtr *)this_00);
      data_00._8_4_ = in_stack_fffffffffffffe20;
      data_00.ptr = (TestTexture *)in_stack_fffffffffffffe18;
      data_00._12_4_ = in_stack_fffffffffffffe24;
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
      operator=(__return_storage_ptr__,data_00);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::~MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_80);
    }
  }
  else if (local_2c == VK_IMAGE_TYPE_2D) {
    if (imageType == VK_IMAGE_TYPE_2D) {
      this_01 = (TestTexture2D *)operator_new(0x70);
      iVar1 = tcu::Vector<int,_3>::x(pIStack_20);
      iVar2 = tcu::Vector<int,_3>::y(pIStack_20);
      TestTexture2D::TestTexture2D
                (this_01,(CompressedTexFormat *)((long)&size_local + 4),iVar1,iVar2);
      de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(&local_a9);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_a8);
      local_98 = de::details::MovePtr::operator_cast_to_PtrData(&local_a8,(MovePtr *)this_01);
      data_01._8_4_ = in_stack_fffffffffffffe20;
      data_01.ptr = (TestTexture *)in_stack_fffffffffffffe18;
      data_01._12_4_ = in_stack_fffffffffffffe24;
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
      operator=(__return_storage_ptr__,data_01);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::~MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_a8);
    }
    else if (((VkImageViewType)size_local == VK_IMAGE_VIEW_TYPE_CUBE) ||
            ((VkImageViewType)size_local == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)) {
      if ((imageType == 6) && ((VkImageViewType)size_local == VK_IMAGE_VIEW_TYPE_CUBE)) {
        this_02 = (TestTextureCube *)operator_new(0x188);
        iVar1 = tcu::Vector<int,_3>::x(pIStack_20);
        TestTextureCube::TestTextureCube
                  (this_02,(CompressedTexFormat *)((long)&size_local + 4),iVar1);
        de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(&local_d1);
        de::details::
        MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
        MovePtr((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                 *)&local_d0);
        local_c0 = de::details::MovePtr::operator_cast_to_PtrData(&local_d0,(MovePtr *)this_02);
        data_02._8_4_ = in_stack_fffffffffffffe20;
        data_02.ptr = (TestTexture *)in_stack_fffffffffffffe18;
        data_02._12_4_ = in_stack_fffffffffffffe24;
        de::details::
        MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
        operator=(__return_storage_ptr__,data_02);
        de::details::
        MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
        ~MovePtr((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_d0);
      }
      else {
        this_03 = (TestTextureCubeArray *)operator_new(0x70);
        iVar1 = tcu::Vector<int,_3>::x(pIStack_20);
        TestTextureCubeArray::TestTextureCubeArray
                  (this_03,(CompressedTexFormat *)((long)&size_local + 4),iVar1,imageType);
        de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(&local_f9);
        de::details::
        MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
        MovePtr((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                 *)&local_f8);
        local_e8 = de::details::MovePtr::operator_cast_to_PtrData(&local_f8,(MovePtr *)this_03);
        data_03._8_4_ = in_stack_fffffffffffffe20;
        data_03.ptr = (TestTexture *)in_stack_fffffffffffffe18;
        data_03._12_4_ = in_stack_fffffffffffffe24;
        de::details::
        MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
        operator=(__return_storage_ptr__,data_03);
        de::details::
        MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
        ~MovePtr((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_f8);
      }
    }
    else {
      this_04 = (TestTexture2DArray *)operator_new(0x78);
      iVar1 = tcu::Vector<int,_3>::x(pIStack_20);
      iVar2 = tcu::Vector<int,_3>::y(pIStack_20);
      TestTexture2DArray::TestTexture2DArray
                (this_04,(CompressedTexFormat *)((long)&size_local + 4),iVar1,iVar2,imageType);
      de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(&local_121);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_120);
      local_110 = de::details::MovePtr::operator_cast_to_PtrData(&local_120,(MovePtr *)this_04);
      data_04._8_4_ = in_stack_fffffffffffffe20;
      data_04.ptr = (TestTexture *)in_stack_fffffffffffffe18;
      data_04._12_4_ = in_stack_fffffffffffffe24;
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::
      operator=(__return_storage_ptr__,data_04);
      de::details::
      MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::~MovePtr
                ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                  *)&local_120);
    }
  }
  else if (local_2c == VK_IMAGE_TYPE_3D) {
    this_05 = (TestTexture3D *)operator_new(0x78);
    iVar1 = tcu::Vector<int,_3>::x(pIStack_20);
    iVar2 = tcu::Vector<int,_3>::y(pIStack_20);
    depth = tcu::Vector<int,_3>::z(pIStack_20);
    TestTexture3D::TestTexture3D
              (this_05,(CompressedTexFormat *)((long)&size_local + 4),iVar1,iVar2,depth);
    de::DefaultDeleter<vkt::pipeline::TestTexture>::DefaultDeleter(&local_149);
    de::details::
    MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::MovePtr
              ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                *)&local_148);
    local_138 = de::details::MovePtr::operator_cast_to_PtrData(&local_148,(MovePtr *)this_05);
    data_05._8_4_ = iVar1;
    data_05.ptr = (TestTexture *)local_138;
    data_05._12_4_ = iVar2;
    de::details::
    MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::operator=
              (__return_storage_ptr__,data_05);
    de::details::
    MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>::~MovePtr
              ((MovePtr<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                *)&local_148);
  }
  return __return_storage_ptr__;
}

Assistant:

static MovePtr<TestTexture> createTestTexture (const TcuFormatType format, VkImageViewType viewType, const tcu::IVec3& size, int layerCount)
{
	MovePtr<TestTexture>	texture;
	const VkImageType		imageType = getCompatibleImageType(viewType);

	switch (imageType)
	{
		case VK_IMAGE_TYPE_1D:
			if (layerCount == 1)
				texture = MovePtr<TestTexture>(new TestTexture1D(format, size.x()));
			else
				texture = MovePtr<TestTexture>(new TestTexture1DArray(format, size.x(), layerCount));

			break;

		case VK_IMAGE_TYPE_2D:
			if (layerCount == 1)
			{
				texture = MovePtr<TestTexture>(new TestTexture2D(format, size.x(), size.y()));
			}
			else
			{
				if (viewType == VK_IMAGE_VIEW_TYPE_CUBE || viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)
				{
					if (layerCount == tcu::CUBEFACE_LAST && viewType == VK_IMAGE_VIEW_TYPE_CUBE)
					{
						texture = MovePtr<TestTexture>(new TestTextureCube(format, size.x()));
					}
					else
					{
						DE_ASSERT(layerCount % tcu::CUBEFACE_LAST == 0);

						texture = MovePtr<TestTexture>(new TestTextureCubeArray(format, size.x(), layerCount));
					}
				}
				else
				{
					texture = MovePtr<TestTexture>(new TestTexture2DArray(format, size.x(), size.y(), layerCount));
				}
			}

			break;

		case VK_IMAGE_TYPE_3D:
			texture = MovePtr<TestTexture>(new TestTexture3D(format, size.x(), size.y(), size.z()));
			break;

		default:
			DE_ASSERT(false);
	}

	return texture;
}